

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

void hit(char *str,boolean silently,monst *mtmp,char *force)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *force_local;
  monst *mtmp_local;
  boolean silently_local;
  char *str_local;
  
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0034855b;
      if ((((u.uprops[0x1e].intrinsic == 0) &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         (((u.uprops[0x40].intrinsic != 0 ||
           ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          ((mtmp->data->mflags3 & 0x200) != 0)))) {
        bVar1 = viz_array[mtmp->my][mtmp->mx] & 1;
        goto joined_r0x00348555;
      }
    }
    else {
      bVar1 = worm_known(level,mtmp);
joined_r0x00348555:
      if (bVar1 != 0) {
LAB_0034855b:
        if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
              (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
            (((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
             ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)))) && (((byte)u._1052_1_ >> 5 & 1) == 0))
        goto LAB_003487d6;
      }
    }
    if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
         ((poVar4 = which_armor(mtmp,4), poVar4 != (obj *)0x0 &&
          (poVar4 = which_armor(mtmp,4), poVar4->otyp == 0x4f)))) ||
        (((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
          (u.uprops[0x19].blocked != 0)) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        ((bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0' &&
         (((u._1052_1_ & 1) == 0 || (mtmp != u.ustuck)))))))) goto LAB_003487e3;
  }
LAB_003487d6:
  if (flags.verbose != '\0') {
    pcVar5 = The(str);
    pcVar6 = "";
    if (silently != '\0') {
      pcVar6 = "silently ";
    }
    pcVar7 = vtense(str,"hit");
    pcVar8 = mon_nam(mtmp);
    pline("%s %s%s %s%s",pcVar5,pcVar6,pcVar7,pcVar8,force);
    return;
  }
LAB_003487e3:
  pcVar5 = The(str);
  pcVar6 = vtense(str,"hit");
  pline("%s %s it.",pcVar5,pcVar6);
  return;
}

Assistant:

void hit(const char *str, boolean silently, struct monst *mtmp,
	 const char *force)	/* usually either "." or "!" */
{
	if ((!cansee(bhitpos.x,bhitpos.y) && !canspotmon(level, mtmp) &&
	     !(u.uswallow && mtmp == u.ustuck))
	   || !flags.verbose)
	    pline("%s %s it.", The(str), vtense(str, "hit"));
	else pline("%s %s%s %s%s",
		   The(str), (silently ? "silently ": ""), vtense(str, "hit"),
		   mon_nam(mtmp), force);
}